

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O1

AffixTag __thiscall
icu_63::number::impl::AffixUtils::nextToken
          (AffixUtils *this,AffixTag tag,UnicodeString *patternString,UErrorCode *status)

{
  short sVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  UnicodeString *this_00;
  uint offset;
  ulong unaff_R12;
  ulong unaff_R14;
  bool bVar6;
  AffixTag AVar7;
  uint local_3c;
  
  this_00 = tag._8_8_;
  uVar4 = tag._0_8_;
  do {
    sVar1 = (this_00->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar5 = (this_00->fUnion).fFields.fLength;
    }
    else {
      iVar5 = (int)sVar1 >> 5;
    }
    offset = (uint)this;
    if (iVar5 <= (int)offset) {
      switch((int)uVar4) {
      case 1:
      case 2:
        *(undefined4 *)&(patternString->super_Replaceable).super_UObject._vptr_UObject = 1;
        goto LAB_00253749;
      default:
LAB_00253749:
        local_3c = 0xffffffff;
        uVar3 = unaff_R14 & 0xffffffff;
        goto LAB_002537a4;
      case 4:
        unaff_R12 = 0xfffffffb00000000;
        break;
      case 5:
        unaff_R12 = 0xfffffffa00000000;
        break;
      case 6:
        unaff_R12 = 0xfffffff900000000;
        break;
      case 7:
        unaff_R12 = 0xfffffff800000000;
        break;
      case 8:
        unaff_R12 = 0xfffffff700000000;
        break;
      case 9:
        unaff_R12 = 0xfffffff100000000;
      }
      uVar3 = 0;
      local_3c = offset;
      break;
    }
    uVar2 = UnicodeString::char32At(this_00,offset);
    uVar3 = (ulong)uVar2;
    iVar5 = 2 - (uint)(uVar2 < 0x10000);
    bVar6 = true;
    switch(uVar4 & 0xffffffff) {
    case 0:
      switch(uVar2) {
      case 0x25:
        uVar3 = 0;
        unaff_R12 = 0xfffffffd00000000;
        break;
      case 0x26:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2c:
switchD_00253538_caseD_26:
        unaff_R12 = 0;
        break;
      case 0x27:
        uVar4 = 1;
LAB_0025370c:
        uVar3 = unaff_R14 & 0xffffffff;
        this = (AffixUtils *)(ulong)(iVar5 + offset);
        goto LAB_002536aa;
      case 0x2b:
        uVar3 = 0;
        unaff_R12 = 0xfffffffe00000000;
        break;
      case 0x2d:
        uVar3 = 0;
        unaff_R12 = 0xffffffff00000000;
        break;
      default:
        if (uVar2 == 0xa4) {
          uVar4 = 4;
          goto LAB_0025370c;
        }
        if (uVar2 != 0x2030) goto switchD_00253538_caseD_26;
        uVar3 = 0;
        unaff_R12 = 0xfffffffc00000000;
      }
      uVar4 = 0;
      local_3c = iVar5 + offset;
      goto LAB_002536a8;
    case 1:
      unaff_R12 = (ulong)((uint)(uVar2 != 0x27) * 2);
      uVar4 = 1;
      goto LAB_002535f3;
    case 2:
      bVar6 = uVar2 == 0x27;
      if (!bVar6) {
        unaff_R12 = 2;
      }
      unaff_R14 = unaff_R14 & 0xffffffff;
      if (!bVar6) {
        unaff_R14 = (ulong)uVar2;
        local_3c = iVar5 + offset;
      }
      this = (AffixUtils *)((ulong)this & 0xffffffff);
      if (bVar6) {
        this = (AffixUtils *)(ulong)(iVar5 + offset);
      }
      uVar4 = (ulong)(bVar6 | 2);
      break;
    case 3:
      uVar4 = 0;
      if (uVar2 != 0x27) break;
      uVar4 = 3;
      uVar3 = 0x27;
      unaff_R12 = 2;
LAB_002535f3:
      local_3c = iVar5 + offset;
      bVar6 = false;
      goto LAB_002536aa;
    case 4:
      if (uVar2 == 0xa4) {
        this = (AffixUtils *)(ulong)(offset + iVar5);
        uVar4 = 5;
        break;
      }
      uVar4 = 4;
      unaff_R12 = 0xfffffffb00000000;
LAB_002536a4:
      uVar3 = 0;
      local_3c = offset;
LAB_002536a8:
      bVar6 = false;
      goto LAB_002536aa;
    case 5:
      if (uVar2 != 0xa4) {
        uVar4 = 5;
        unaff_R12 = 0xfffffffa00000000;
        goto LAB_002536a4;
      }
      this = (AffixUtils *)(ulong)(offset + iVar5);
      uVar4 = 6;
      break;
    case 6:
      if (uVar2 != 0xa4) {
        uVar4 = 6;
        unaff_R12 = 0xfffffff900000000;
        goto LAB_002536a4;
      }
      this = (AffixUtils *)(ulong)(offset + iVar5);
      uVar4 = 7;
      break;
    case 7:
      if (uVar2 != 0xa4) {
        uVar4 = 7;
        unaff_R12 = 0xfffffff800000000;
        goto LAB_002536a4;
      }
      this = (AffixUtils *)(ulong)(offset + iVar5);
      uVar4 = 8;
      break;
    case 8:
      if (uVar2 != 0xa4) {
        uVar4 = 8;
        unaff_R12 = 0xfffffff700000000;
        goto LAB_002536a4;
      }
      this = (AffixUtils *)(ulong)(offset + iVar5);
      uVar4 = 9;
      break;
    case 9:
      uVar4 = 9;
      if (uVar2 != 0xa4) {
        unaff_R12 = 0xfffffff100000000;
        goto LAB_002536a4;
      }
      this = (AffixUtils *)(ulong)(offset + iVar5);
    }
    uVar3 = unaff_R14 & 0xffffffff;
LAB_002536aa:
    unaff_R14 = uVar3;
  } while (bVar6);
LAB_002537a4:
  uVar4 = (ulong)local_3c | uVar3 << 0x20;
  AVar7.state = (int)unaff_R12;
  AVar7.type = (int)(unaff_R12 >> 0x20);
  AVar7.offset = (int)uVar4;
  AVar7.codePoint = (int)(uVar4 >> 0x20);
  return AVar7;
}

Assistant:

AffixTag AffixUtils::nextToken(AffixTag tag, const UnicodeString &patternString, UErrorCode &status) {
    int32_t offset = tag.offset;
    int32_t state = tag.state;
    for (; offset < patternString.length();) {
        UChar32 cp = patternString.char32At(offset);
        int32_t count = U16_LENGTH(cp);

        switch (state) {
            case STATE_BASE:
                switch (cp) {
                    case u'\'':
                        state = STATE_FIRST_QUOTE;
                        offset += count;
                        // continue to the next code point
                        break;
                    case u'-':
                        return makeTag(offset + count, TYPE_MINUS_SIGN, STATE_BASE, 0);
                    case u'+':
                        return makeTag(offset + count, TYPE_PLUS_SIGN, STATE_BASE, 0);
                    case u'%':
                        return makeTag(offset + count, TYPE_PERCENT, STATE_BASE, 0);
                    case u'‰':
                        return makeTag(offset + count, TYPE_PERMILLE, STATE_BASE, 0);
                    case u'¤':
                        state = STATE_FIRST_CURR;
                        offset += count;
                        // continue to the next code point
                        break;
                    default:
                        return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                }
                break;
            case STATE_FIRST_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_BASE, cp);
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_INSIDE_QUOTE:
                if (cp == u'\'') {
                    state = STATE_AFTER_QUOTE;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                }
            case STATE_AFTER_QUOTE:
                if (cp == u'\'') {
                    return makeTag(offset + count, TYPE_CODEPOINT, STATE_INSIDE_QUOTE, cp);
                } else {
                    state = STATE_BASE;
                    // re-evaluate this code point
                    break;
                }
            case STATE_FIRST_CURR:
                if (cp == u'¤') {
                    state = STATE_SECOND_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
                }
            case STATE_SECOND_CURR:
                if (cp == u'¤') {
                    state = STATE_THIRD_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
                }
            case STATE_THIRD_CURR:
                if (cp == u'¤') {
                    state = STATE_FOURTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
                }
            case STATE_FOURTH_CURR:
                if (cp == u'¤') {
                    state = STATE_FIFTH_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
                }
            case STATE_FIFTH_CURR:
                if (cp == u'¤') {
                    state = STATE_OVERFLOW_CURR;
                    offset += count;
                    // continue to the next code point
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
                }
            case STATE_OVERFLOW_CURR:
                if (cp == u'¤') {
                    offset += count;
                    // continue to the next code point and loop back to this state
                    break;
                } else {
                    return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
                }
            default:
                U_ASSERT(false);
        }
    }
    // End of string
    switch (state) {
        case STATE_BASE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_QUOTE:
        case STATE_INSIDE_QUOTE:
            // For consistent behavior with the JDK and ICU 58, set an error here.
            status = U_ILLEGAL_ARGUMENT_ERROR;
            return {-1};
        case STATE_AFTER_QUOTE:
            // No more tokens in string.
            return {-1};
        case STATE_FIRST_CURR:
            return makeTag(offset, TYPE_CURRENCY_SINGLE, STATE_BASE, 0);
        case STATE_SECOND_CURR:
            return makeTag(offset, TYPE_CURRENCY_DOUBLE, STATE_BASE, 0);
        case STATE_THIRD_CURR:
            return makeTag(offset, TYPE_CURRENCY_TRIPLE, STATE_BASE, 0);
        case STATE_FOURTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUAD, STATE_BASE, 0);
        case STATE_FIFTH_CURR:
            return makeTag(offset, TYPE_CURRENCY_QUINT, STATE_BASE, 0);
        case STATE_OVERFLOW_CURR:
            return makeTag(offset, TYPE_CURRENCY_OVERFLOW, STATE_BASE, 0);
        default:
            U_ASSERT(false);
            return {-1}; // suppress "control reaches end of non-void function"
    }
}